

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O3

void destroy_thread_sync_data(thread_sync_data *tsd)

{
  if (tsd->mtx != (pthread_mutex_t *)0x0) {
    pthread_mutex_destroy((pthread_mutex_t *)tsd->mtx);
    (*Curl_cfree)(tsd->mtx);
  }
  (*Curl_cfree)(tsd->hostname);
  if (tsd->res != (Curl_addrinfo *)0x0) {
    Curl_freeaddrinfo(tsd->res);
  }
  if (tsd->sock_pair[1] != -1) {
    close(tsd->sock_pair[1]);
  }
  (tsd->hints).ai_next = (addrinfo *)0x0;
  tsd->td = (thread_data *)0x0;
  (tsd->hints).ai_addr = (sockaddr *)0x0;
  (tsd->hints).ai_canonname = (char *)0x0;
  (tsd->hints).ai_socktype = 0;
  (tsd->hints).ai_protocol = 0;
  *(undefined8 *)&(tsd->hints).ai_addrlen = 0;
  tsd->res = (Curl_addrinfo *)0x0;
  (tsd->hints).ai_flags = 0;
  (tsd->hints).ai_family = 0;
  tsd->sock_pair[0] = 0;
  tsd->sock_pair[1] = 0;
  *(undefined8 *)&tsd->sock_error = 0;
  tsd->hostname = (char *)0x0;
  tsd->data = (Curl_easy *)0x0;
  tsd->mtx = (pthread_mutex_t *)0x0;
  tsd->done = 0;
  tsd->port = 0;
  return;
}

Assistant:

static
void destroy_thread_sync_data(struct thread_sync_data *tsd)
{
  if(tsd->mtx) {
    Curl_mutex_destroy(tsd->mtx);
    free(tsd->mtx);
  }

  free(tsd->hostname);

  if(tsd->res)
    Curl_freeaddrinfo(tsd->res);

#ifndef CURL_DISABLE_SOCKETPAIR
  /*
   * close one end of the socket pair (may be done in resolver thread);
   * the other end (for reading) is always closed in the parent thread.
   */
  if(tsd->sock_pair[1] != CURL_SOCKET_BAD) {
    wakeup_close(tsd->sock_pair[1]);
  }
#endif
  memset(tsd, 0, sizeof(*tsd));
}